

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O1

void opengv::relative_pose::modules::fivept_kneip::sPolynomial47
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[0x29a8];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0xe9f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x29ea] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[0x2b23];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x148d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x2caf] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1553] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2bfa] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1595] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2c3c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1619] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2cc0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x165b] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2d02] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x16df] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2d86] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x18ad] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2dc8] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1e9b] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e0a] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1edd] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e4c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1f1f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e8e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1f61] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2ed0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1fa3] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f12] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1fe5] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f54] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2027] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f96] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x21f5] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2fd8] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2405] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x301a] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x292d] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x30cf] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2a35] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x305c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2a77] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x309e] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2ab9] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x30e0] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2afb] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x3122] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2b3d] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x3164] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2b7f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x31a6] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2bc1] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x31e8] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2d8f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x322a] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2f9f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x326c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x31f1] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x32ae] / dVar1;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::sPolynomial47( Eigen::Matrix<double,66,197> & groebnerMatrix )
{
  groebnerMatrix(47,56) = -groebnerMatrix(38,162)/(groebnerMatrix(38,161));
  groebnerMatrix(47,79) = groebnerMatrix(21,173)/(groebnerMatrix(21,167));
  groebnerMatrix(47,82) = -groebnerMatrix(38,170)/(groebnerMatrix(38,161));
  groebnerMatrix(47,83) = -groebnerMatrix(38,171)/(groebnerMatrix(38,161));
  groebnerMatrix(47,85) = -groebnerMatrix(38,173)/(groebnerMatrix(38,161));
  groebnerMatrix(47,86) = -groebnerMatrix(38,174)/(groebnerMatrix(38,161));
  groebnerMatrix(47,88) = -groebnerMatrix(38,176)/(groebnerMatrix(38,161));
  groebnerMatrix(47,95) = -groebnerMatrix(38,177)/(groebnerMatrix(38,161));
  groebnerMatrix(47,118) = -groebnerMatrix(38,178)/(groebnerMatrix(38,161));
  groebnerMatrix(47,119) = -groebnerMatrix(38,179)/(groebnerMatrix(38,161));
  groebnerMatrix(47,120) = -groebnerMatrix(38,180)/(groebnerMatrix(38,161));
  groebnerMatrix(47,121) = -groebnerMatrix(38,181)/(groebnerMatrix(38,161));
  groebnerMatrix(47,122) = -groebnerMatrix(38,182)/(groebnerMatrix(38,161));
  groebnerMatrix(47,123) = -groebnerMatrix(38,183)/(groebnerMatrix(38,161));
  groebnerMatrix(47,124) = -groebnerMatrix(38,184)/(groebnerMatrix(38,161));
  groebnerMatrix(47,131) = -groebnerMatrix(38,185)/(groebnerMatrix(38,161));
  groebnerMatrix(47,139) = -groebnerMatrix(38,186)/(groebnerMatrix(38,161));
  groebnerMatrix(47,159) = groebnerMatrix(21,189)/(groebnerMatrix(21,167));
  groebnerMatrix(47,163) = -groebnerMatrix(38,187)/(groebnerMatrix(38,161));
  groebnerMatrix(47,164) = -groebnerMatrix(38,188)/(groebnerMatrix(38,161));
  groebnerMatrix(47,165) = -groebnerMatrix(38,189)/(groebnerMatrix(38,161));
  groebnerMatrix(47,166) = -groebnerMatrix(38,190)/(groebnerMatrix(38,161));
  groebnerMatrix(47,167) = -groebnerMatrix(38,191)/(groebnerMatrix(38,161));
  groebnerMatrix(47,168) = -groebnerMatrix(38,192)/(groebnerMatrix(38,161));
  groebnerMatrix(47,169) = -groebnerMatrix(38,193)/(groebnerMatrix(38,161));
  groebnerMatrix(47,176) = -groebnerMatrix(38,194)/(groebnerMatrix(38,161));
  groebnerMatrix(47,184) = -groebnerMatrix(38,195)/(groebnerMatrix(38,161));
  groebnerMatrix(47,193) = -groebnerMatrix(38,196)/(groebnerMatrix(38,161));
}